

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Woop<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  bool bVar16;
  byte bVar17;
  bool bVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  byte bVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar40 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2530 [16];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2530 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_23e0._4_4_ = uVar1;
  local_23e0._0_4_ = uVar1;
  local_23e0._8_4_ = uVar1;
  local_23e0._12_4_ = uVar1;
  local_23e0._16_4_ = uVar1;
  local_23e0._20_4_ = uVar1;
  local_23e0._24_4_ = uVar1;
  local_23e0._28_4_ = uVar1;
  auVar37 = ZEXT3264(local_23e0);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_2400._4_4_ = uVar1;
  local_2400._0_4_ = uVar1;
  local_2400._8_4_ = uVar1;
  local_2400._12_4_ = uVar1;
  local_2400._16_4_ = uVar1;
  local_2400._20_4_ = uVar1;
  local_2400._24_4_ = uVar1;
  local_2400._28_4_ = uVar1;
  auVar38 = ZEXT3264(local_2400);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_2420._4_4_ = uVar1;
  local_2420._0_4_ = uVar1;
  local_2420._8_4_ = uVar1;
  local_2420._12_4_ = uVar1;
  local_2420._16_4_ = uVar1;
  local_2420._20_4_ = uVar1;
  local_2420._24_4_ = uVar1;
  local_2420._28_4_ = uVar1;
  auVar39 = ZEXT3264(local_2420);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  pauVar24 = (undefined1 (*) [16])local_2390;
  bVar18 = false;
  do {
    local_2440 = vsubps_avx(auVar37._0_32_,auVar30);
    fVar6 = auVar30._0_4_;
    fVar7 = auVar30._4_4_;
    fVar8 = auVar30._8_4_;
    fVar9 = auVar30._12_4_;
    fVar10 = auVar30._16_4_;
    fVar11 = auVar30._20_4_;
    fVar12 = auVar30._24_4_;
    local_2460 = auVar37._0_4_ + fVar6;
    fStack_245c = auVar37._4_4_ + fVar7;
    fStack_2458 = auVar37._8_4_ + fVar8;
    fStack_2454 = auVar37._12_4_ + fVar9;
    fStack_2450 = auVar37._16_4_ + fVar10;
    fStack_244c = auVar37._20_4_ + fVar11;
    fStack_2448 = auVar37._24_4_ + fVar12;
    fStack_2444 = auVar37._28_4_ + auVar30._28_4_;
    local_2480 = vsubps_avx(auVar38._0_32_,auVar32);
    local_24a0 = auVar38._0_4_ + auVar32._0_4_;
    fStack_249c = auVar38._4_4_ + auVar32._4_4_;
    fStack_2498 = auVar38._8_4_ + auVar32._8_4_;
    fStack_2494 = auVar38._12_4_ + auVar32._12_4_;
    fStack_2490 = auVar38._16_4_ + auVar32._16_4_;
    fStack_248c = auVar38._20_4_ + auVar32._20_4_;
    fStack_2488 = auVar38._24_4_ + auVar32._24_4_;
    fStack_2484 = auVar38._28_4_ + auVar32._28_4_;
    local_24c0 = vsubps_avx(auVar39._0_32_,auVar35);
    local_24e0._0_4_ = auVar39._0_4_ + auVar35._0_4_;
    local_24e0._4_4_ = auVar39._4_4_ + auVar35._4_4_;
    local_24e0._8_4_ = auVar39._8_4_ + auVar35._8_4_;
    local_24e0._12_4_ = auVar39._12_4_ + auVar35._12_4_;
    local_24e0._16_4_ = auVar39._16_4_ + auVar35._16_4_;
    local_24e0._20_4_ = auVar39._20_4_ + auVar35._20_4_;
    local_24e0._24_4_ = auVar39._24_4_ + auVar35._24_4_;
    local_24e0._28_4_ = auVar39._28_4_ + auVar35._28_4_;
    auVar40._0_4_ = fVar6 * fVar6;
    auVar40._4_4_ = fVar7 * fVar7;
    auVar40._8_4_ = fVar8 * fVar8;
    auVar40._12_4_ = fVar9 * fVar9;
    auVar40._16_4_ = fVar10 * fVar10;
    auVar40._20_4_ = fVar11 * fVar11;
    auVar40._28_36_ = in_ZMM11._28_36_;
    auVar40._24_4_ = fVar12 * fVar12;
    in_ZMM11 = ZEXT3264(auVar40._0_32_);
    local_23c0 = auVar40._0_32_;
LAB_00e5b540:
    do {
      do {
        if (pauVar24 == (undefined1 (*) [16])&local_23a0) {
          return bVar18;
        }
        pauVar19 = pauVar24 + -1;
        pauVar24 = pauVar24 + -1;
      } while ((float)local_2530._0_4_ < *(float *)(*pauVar19 + 8));
      uVar20 = *(ulong *)*pauVar24;
LAB_00e5b566:
      auVar30 = auVar37._0_32_;
      auVar32 = auVar38._0_32_;
      auVar35 = auVar39._0_32_;
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        if ((uVar20 & 8) != 0) goto LAB_00e5b9a7;
        auVar13 = vmaxps_avx(auVar30,*(undefined1 (*) [32])(uVar20 + 0x40));
        auVar33 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar20 + 0x60));
        auVar13 = vmaxps_avx(auVar32,*(undefined1 (*) [32])(uVar20 + 0x80));
        auVar33 = vsubps_avx(auVar33,auVar30);
        auVar30 = vminps_avx(auVar13,*(undefined1 (*) [32])(uVar20 + 0xa0));
        auVar32 = vsubps_avx(auVar30,auVar32);
        auVar30 = vmaxps_avx(auVar35,*(undefined1 (*) [32])(uVar20 + 0xc0));
        auVar30 = vminps_avx(auVar30,*(undefined1 (*) [32])(uVar20 + 0xe0));
        auVar30 = vsubps_avx(auVar30,auVar35);
        local_2500._0_4_ =
             auVar33._0_4_ * auVar33._0_4_ + auVar32._0_4_ * auVar32._0_4_ +
             auVar30._0_4_ * auVar30._0_4_;
        local_2500._4_4_ =
             auVar33._4_4_ * auVar33._4_4_ + auVar32._4_4_ * auVar32._4_4_ +
             auVar30._4_4_ * auVar30._4_4_;
        fStack_24f8 = auVar33._8_4_ * auVar33._8_4_ + auVar32._8_4_ * auVar32._8_4_ +
                      auVar30._8_4_ * auVar30._8_4_;
        fStack_24f4 = auVar33._12_4_ * auVar33._12_4_ + auVar32._12_4_ * auVar32._12_4_ +
                      auVar30._12_4_ * auVar30._12_4_;
        fStack_24f0 = auVar33._16_4_ * auVar33._16_4_ + auVar32._16_4_ * auVar32._16_4_ +
                      auVar30._16_4_ * auVar30._16_4_;
        fStack_24ec = auVar33._20_4_ * auVar33._20_4_ + auVar32._20_4_ * auVar32._20_4_ +
                      auVar30._20_4_ * auVar30._20_4_;
        fStack_24e8 = auVar33._24_4_ * auVar33._24_4_ + auVar32._24_4_ * auVar32._24_4_ +
                      auVar30._24_4_ * auVar30._24_4_;
        fStack_24e4 = auVar33._28_4_ + auVar32._28_4_ + auVar32._28_4_;
        auVar30 = vcmpps_avx(_local_2500,in_ZMM11._0_32_,2);
        auVar32 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x40),
                             *(undefined1 (*) [32])(uVar20 + 0x60),2);
        auVar30 = vandps_avx(auVar30,auVar32);
        auVar28 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
LAB_00e5b5f6:
        auVar28 = vpsllw_avx(auVar28,0xf);
        if ((((((((auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar28[0xf] < '\0') {
          auVar28 = vpacksswb_avx(auVar28,auVar28);
          bVar17 = SUB161(auVar28 >> 7,0) & 1 | (SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar28 >> 0x17,0) & 1) << 2 | (SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar28 >> 0x27,0) & 1) << 4 | (SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar28 >> 0x37,0) & 1) << 6 | SUB161(auVar28 >> 0x3f,0) << 7;
          uVar25 = uVar20 & 0xfffffffffffffff0;
          lVar21 = 0;
          if (bVar17 != 0) {
            for (; (bVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar20 = *(ulong *)(uVar25 + lVar21 * 8);
          uVar23 = bVar17 - 1 & (uint)bVar17;
          if (uVar23 != 0) {
            uVar3 = *(uint *)(local_2500 + lVar21 * 4);
            lVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar25 + lVar21 * 8);
            uVar4 = *(uint *)(local_2500 + lVar21 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            if (uVar23 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar24 = uVar5;
                *(uint *)(*pauVar24 + 8) = uVar4;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(ulong *)*pauVar24 = uVar20;
                *(uint *)(*pauVar24 + 8) = uVar3;
                pauVar24 = pauVar24 + 1;
                uVar20 = uVar5;
              }
            }
            else {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar20;
              auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar3));
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar5;
              auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar4));
              lVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
              auVar29 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
              auVar34 = vpcmpgtd_avx(auVar31,auVar28);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar36 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar31,auVar28,auVar36);
                auVar28 = vblendvps_avx(auVar28,auVar31,auVar36);
                auVar31 = vpcmpgtd_avx(auVar29,auVar34);
                auVar36 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar29,auVar34,auVar36);
                auVar34 = vblendvps_avx(auVar34,auVar29,auVar36);
                auVar29 = vpcmpgtd_avx(auVar34,auVar28);
                auVar36 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar34,auVar28,auVar36);
                auVar28 = vblendvps_avx(auVar28,auVar34,auVar36);
                *pauVar24 = auVar28;
                pauVar24[1] = auVar29;
                uVar20 = auVar31._0_8_;
                pauVar24 = pauVar24 + 2;
              }
              else {
                lVar21 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                auVar36._8_8_ = 0;
                auVar36._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
                auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
                uVar23 = uVar23 - 1 & uVar23;
                uVar20 = (ulong)uVar23;
                if (uVar23 == 0) {
                  auVar15 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar31,auVar28,auVar15);
                  auVar28 = vblendvps_avx(auVar28,auVar31,auVar15);
                  auVar31 = vpcmpgtd_avx(auVar36,auVar29);
                  auVar15 = vpshufd_avx(auVar31,0xaa);
                  auVar31 = vblendvps_avx(auVar36,auVar29,auVar15);
                  auVar29 = vblendvps_avx(auVar29,auVar36,auVar15);
                  auVar36 = vpcmpgtd_avx(auVar29,auVar28);
                  auVar15 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar29,auVar28,auVar15);
                  auVar28 = vblendvps_avx(auVar28,auVar29,auVar15);
                  auVar29 = vpcmpgtd_avx(auVar31,auVar34);
                  auVar15 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar31,auVar34,auVar15);
                  auVar31 = vblendvps_avx(auVar34,auVar31,auVar15);
                  auVar34 = vpcmpgtd_avx(auVar36,auVar31);
                  auVar15 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar36,auVar31,auVar15);
                  auVar31 = vblendvps_avx(auVar31,auVar36,auVar15);
                  *pauVar24 = auVar28;
                  pauVar24[1] = auVar31;
                  pauVar24[2] = auVar34;
                  uVar20 = auVar29._0_8_;
                  pauVar24 = pauVar24 + 3;
                }
                else {
                  *pauVar24 = auVar28;
                  pauVar24[1] = auVar31;
                  pauVar24[2] = auVar29;
                  pauVar19 = pauVar24 + 3;
                  pauVar24[3] = auVar36;
                  do {
                    lVar21 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = *(ulong *)(uVar25 + lVar21 * 8);
                    auVar28 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_2500 + lVar21 * 4)));
                    pauVar19[1] = auVar28;
                    pauVar19 = pauVar19 + 1;
                    uVar20 = uVar20 & uVar20 - 1;
                  } while (uVar20 != 0);
                  lVar21 = 0;
                  while (pauVar19 != pauVar24) {
                    auVar28 = pauVar24[1];
                    uVar23 = vextractps_avx(auVar28,2);
                    for (lVar22 = 0x10;
                        (lVar21 != lVar22 && (*(uint *)(pauVar24[-1] + lVar22 + 8) < uVar23));
                        lVar22 = lVar22 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar24 + lVar22) =
                           *(undefined1 (*) [16])(pauVar24[-1] + lVar22);
                    }
                    *(undefined1 (*) [16])(*pauVar24 + lVar22) = auVar28;
                    lVar21 = lVar21 + -0x10;
                    pauVar24 = pauVar24 + 1;
                  }
                  uVar20 = *(ulong *)*pauVar19;
                  pauVar24 = pauVar19;
                }
              }
            }
          }
          goto LAB_00e5b566;
        }
        goto LAB_00e5b540;
      }
      if ((uVar20 & 8) == 0) {
        auVar13 = *(undefined1 (*) [32])(uVar20 + 0x40);
        auVar33 = *(undefined1 (*) [32])(uVar20 + 0x60);
        auVar14 = vmaxps_avx(auVar30,auVar13);
        auVar14 = vminps_avx(auVar14,auVar33);
        auVar14 = vsubps_avx(auVar14,auVar30);
        auVar30 = vmaxps_avx(auVar32,*(undefined1 (*) [32])(uVar20 + 0x80));
        auVar30 = vminps_avx(auVar30,*(undefined1 (*) [32])(uVar20 + 0xa0));
        auVar32 = vsubps_avx(auVar30,auVar32);
        auVar30 = vmaxps_avx(auVar35,*(undefined1 (*) [32])(uVar20 + 0xc0));
        auVar30 = vminps_avx(auVar30,*(undefined1 (*) [32])(uVar20 + 0xe0));
        auVar30 = vsubps_avx(auVar30,auVar35);
        local_2500._4_4_ =
             auVar14._4_4_ * auVar14._4_4_ + auVar32._4_4_ * auVar32._4_4_ +
             auVar30._4_4_ * auVar30._4_4_;
        local_2500._0_4_ =
             auVar14._0_4_ * auVar14._0_4_ + auVar32._0_4_ * auVar32._0_4_ +
             auVar30._0_4_ * auVar30._0_4_;
        fStack_24f8 = auVar14._8_4_ * auVar14._8_4_ + auVar32._8_4_ * auVar32._8_4_ +
                      auVar30._8_4_ * auVar30._8_4_;
        fStack_24f4 = auVar14._12_4_ * auVar14._12_4_ + auVar32._12_4_ * auVar32._12_4_ +
                      auVar30._12_4_ * auVar30._12_4_;
        fStack_24f0 = auVar14._16_4_ * auVar14._16_4_ + auVar32._16_4_ * auVar32._16_4_ +
                      auVar30._16_4_ * auVar30._16_4_;
        fStack_24ec = auVar14._20_4_ * auVar14._20_4_ + auVar32._20_4_ * auVar32._20_4_ +
                      auVar30._20_4_ * auVar30._20_4_;
        fStack_24e8 = auVar14._24_4_ * auVar14._24_4_ + auVar32._24_4_ * auVar32._24_4_ +
                      auVar30._24_4_ * auVar30._24_4_;
        fStack_24e4 = auVar14._28_4_ + auVar32._28_4_ + auVar30._28_4_;
        auVar30 = vcmpps_avx(auVar13,auVar33,2);
        auVar32 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0xa0),local_2480,5);
        auVar30 = vandps_avx(auVar30,auVar32);
        auVar14._4_4_ = fStack_245c;
        auVar14._0_4_ = local_2460;
        auVar14._8_4_ = fStack_2458;
        auVar14._12_4_ = fStack_2454;
        auVar14._16_4_ = fStack_2450;
        auVar14._20_4_ = fStack_244c;
        auVar14._24_4_ = fStack_2448;
        auVar14._28_4_ = fStack_2444;
        auVar32 = vcmpps_avx(auVar13,auVar14,2);
        auVar13._4_4_ = fStack_249c;
        auVar13._0_4_ = local_24a0;
        auVar13._8_4_ = fStack_2498;
        auVar13._12_4_ = fStack_2494;
        auVar13._16_4_ = fStack_2490;
        auVar13._20_4_ = fStack_248c;
        auVar13._24_4_ = fStack_2488;
        auVar13._28_4_ = fStack_2484;
        auVar35 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x80),auVar13,2);
        auVar32 = vandps_avx(auVar35,auVar32);
        auVar35 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0xe0),local_24c0,5);
        auVar30 = vandps_avx(auVar30,auVar35);
        auVar35 = vcmpps_avx(auVar33,local_2440,5);
        auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0xc0),local_24e0,2);
        auVar35 = vandps_avx(auVar13,auVar35);
        auVar32 = vandps_avx(auVar32,auVar35);
        auVar30 = vandps_avx(auVar32,auVar30);
        auVar33._8_4_ = 0xffff;
        auVar33._0_8_ = 0xffff0000ffff;
        auVar33._12_4_ = 0xffff;
        auVar33._16_4_ = 0xffff;
        auVar33._20_4_ = 0xffff;
        auVar33._24_4_ = 0xffff;
        auVar33._28_4_ = 0xffff;
        auVar30 = vandps_avx(auVar30,auVar33);
        auVar28 = vpackusdw_avx(auVar30._0_16_,auVar30._16_16_);
        goto LAB_00e5b5f6;
      }
LAB_00e5b9a7:
      lVar22 = (uVar20 & 0xfffffffffffffff0) + 0xa0;
      bVar17 = 0;
      for (lVar21 = 0; lVar21 != (ulong)((uint)uVar20 & 0xf) - 8; lVar21 = lVar21 + 1) {
        bVar26 = 0;
        for (lVar27 = -0x10; lVar27 != 0; lVar27 = lVar27 + 4) {
          uVar23 = *(uint *)(lVar22 + lVar27);
          if ((ulong)uVar23 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar23].ptr;
          context->geomID = uVar23;
          context->primID = *(uint *)(lVar22 + 0x10 + lVar27);
          bVar16 = Geometry::pointQuery(this,query,context);
          in_ZMM11 = ZEXT3264(local_23c0);
          auVar39 = ZEXT3264(local_2420);
          auVar38 = ZEXT3264(local_2400);
          auVar37 = ZEXT3264(local_23e0);
          bVar26 = bVar26 | bVar16;
        }
        bVar17 = bVar17 | bVar26;
        lVar22 = lVar22 + 0xb0;
      }
    } while (bVar17 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar30._4_4_ = uVar1;
    auVar30._0_4_ = uVar1;
    auVar30._8_4_ = uVar1;
    auVar30._12_4_ = uVar1;
    auVar30._16_4_ = uVar1;
    auVar30._20_4_ = uVar1;
    auVar30._24_4_ = uVar1;
    auVar30._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar32._4_4_ = uVar1;
    auVar32._0_4_ = uVar1;
    auVar32._8_4_ = uVar1;
    auVar32._12_4_ = uVar1;
    auVar32._16_4_ = uVar1;
    auVar32._20_4_ = uVar1;
    auVar32._24_4_ = uVar1;
    auVar32._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar35._4_4_ = uVar1;
    auVar35._0_4_ = uVar1;
    auVar35._8_4_ = uVar1;
    auVar35._12_4_ = uVar1;
    auVar35._16_4_ = uVar1;
    auVar35._20_4_ = uVar1;
    auVar35._24_4_ = uVar1;
    auVar35._28_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2530 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar18 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }